

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<float>::TPZVec(TPZVec<float> *this,int64_t size,float *copy)

{
  float fVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  this->fStore = (float *)0x0;
  if (size < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec<float>::TPZVec(const int64_t, const T &) [T = float]",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n",0x23);
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else if (size == 0) {
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    uVar4 = 0;
    pfVar3 = (float *)operator_new__(-(ulong)((ulong)size >> 0x3e != 0) | size * 4);
    this->fStore = pfVar3;
    this->fNElements = size;
    this->fNAlloc = size;
    auVar2 = _DAT_014d28c0;
    fVar1 = *copy;
    lVar5 = size + -1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6 = auVar6 ^ _DAT_014d28c0;
    auVar8 = _DAT_014d2b10;
    auVar9 = _DAT_014d28b0;
    do {
      auVar10 = auVar9 ^ auVar2;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_)
                & 1)) {
        pfVar3[uVar4] = fVar1;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        pfVar3[uVar4 + 1] = fVar1;
      }
      auVar10 = auVar8 ^ auVar2;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
        pfVar3[uVar4 + 2] = fVar1;
        pfVar3[uVar4 + 3] = fVar1;
      }
      uVar4 = uVar4 + 4;
      lVar5 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar5 + 4;
      lVar5 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar5 + 4;
    } while ((size + 3U & 0xfffffffffffffffc) != uVar4);
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}